

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O2

bool __thiscall
crnlib::dxt1_endpoint_optimizer::try_average_block_as_solid(dxt1_endpoint_optimizer *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  unique_color *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  bool bVar8;
  long lVar9;
  params *ppVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  uint i;
  ulong uVar15;
  uint i_1;
  ulong uVar16;
  ulong uVar17;
  dxt1_solution_coordinates local_4c;
  undefined8 local_48;
  ulong local_40;
  ulong local_38;
  
  puVar4 = (this->m_unique_colors).m_p;
  uVar13 = 0;
  lVar11 = 0;
  lVar12 = 0;
  lVar9 = 0;
  for (uVar15 = 0; (this->m_unique_colors).m_size != uVar15; uVar15 = uVar15 + 1) {
    uVar14 = (ulong)puVar4[uVar15].m_weight;
    uVar13 = uVar13 + puVar4[uVar15].m_weight;
    lVar9 = lVar9 + puVar4[uVar15].m_color.field_0.field_0.r * uVar14;
    lVar12 = lVar12 + puVar4[uVar15].m_color.field_0.field_0.g * uVar14;
    lVar11 = lVar11 + puVar4[uVar15].m_color.field_0.field_0.b * uVar14;
  }
  uVar14 = CONCAT44(0,uVar13);
  uVar15 = (ulong)(uVar13 >> 1);
  local_38 = (lVar9 + uVar15) / uVar14;
  local_40 = (lVar12 + uVar15) / uVar14;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar14;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = lVar11 + uVar15;
  local_48 = SUB168(auVar6 / auVar5,0);
  uVar14 = local_38 & 0xffffffff;
  uVar16 = local_40 & 0xffffffff;
  uVar15 = (ulong)SUB164(auVar6 / auVar5,0);
  local_4c.m_low_color =
       (ushort)(byte)ryg_dxt::OMatch5[uVar15 * 2] |
       (ushort)(byte)ryg_dxt::OMatch6[uVar16 * 2] << 5 |
       (ushort)(byte)ryg_dxt::OMatch5[uVar14 * 2] << 0xb;
  local_4c.m_high_color =
       (ushort)(byte)ryg_dxt::OMatch5[uVar15 * 2 + 1] |
       (ushort)(byte)ryg_dxt::OMatch6[uVar16 * 2 + 1] << 5 |
       (ushort)(byte)ryg_dxt::OMatch5[uVar14 * 2 + 1] << 0xb;
  bVar7 = evaluate_solution(this,&local_4c,false);
  ppVar10 = this->m_pParams;
  if ((ppVar10->m_use_alpha_blocks == true) && ((this->m_best_solution).m_error != 0)) {
    local_4c.m_low_color =
         (ushort)(byte)ryg_dxt::OMatch5_3[uVar15 * 2] |
         (ushort)(byte)ryg_dxt::OMatch6_3[uVar16 * 2] << 5 |
         (ushort)(byte)ryg_dxt::OMatch5_3[uVar14 * 2] << 0xb;
    local_4c.m_high_color =
         (ushort)(byte)ryg_dxt::OMatch5_3[uVar15 * 2 + 1] |
         (ushort)(byte)ryg_dxt::OMatch6_3[uVar16 * 2 + 1] << 5 |
         (ushort)(byte)ryg_dxt::OMatch5_3[uVar14 * 2 + 1] << 0xb;
    bVar8 = evaluate_solution(this,&local_4c,false);
    bVar7 = bVar7 || bVar8;
    ppVar10 = this->m_pParams;
  }
  if (ppVar10->m_quality == cCRNDXTQualityUber) {
    for (uVar15 = 0; uVar15 < (this->m_unique_colors).m_size; uVar15 = uVar15 + 1) {
      puVar4 = (this->m_unique_colors).m_p;
      bVar1 = puVar4[uVar15].m_color.field_0.field_0.r;
      uVar14 = (ulong)bVar1;
      bVar2 = puVar4[uVar15].m_color.field_0.field_0.g;
      uVar16 = (ulong)bVar2;
      bVar3 = puVar4[uVar15].m_color.field_0.field_0.b;
      uVar17 = (ulong)bVar3;
      if (((bVar1 != (uint)local_38) || (bVar2 != (uint)local_40)) || (bVar3 != (uint)local_48)) {
        local_4c.m_low_color =
             (ushort)(byte)ryg_dxt::OMatch5[uVar17 * 2] |
             (ushort)(byte)ryg_dxt::OMatch6[uVar16 * 2] << 5 |
             (ushort)(byte)ryg_dxt::OMatch5[uVar14 * 2] << 0xb;
        local_4c.m_high_color =
             (ushort)(byte)ryg_dxt::OMatch5[uVar17 * 2 + 1] |
             (ushort)(byte)ryg_dxt::OMatch6[uVar16 * 2 + 1] << 5 |
             (ushort)(byte)ryg_dxt::OMatch5[uVar14 * 2 + 1] << 0xb;
        bVar8 = evaluate_solution(this,&local_4c,false);
        bVar7 = (bool)(bVar7 | bVar8);
        if ((this->m_pParams->m_use_alpha_blocks == true) && ((this->m_best_solution).m_error != 0))
        {
          local_4c.m_low_color =
               (ushort)(byte)ryg_dxt::OMatch5_3[uVar17 * 2] |
               (ushort)(byte)ryg_dxt::OMatch6_3[uVar16 * 2] << 5 |
               (ushort)(byte)ryg_dxt::OMatch5_3[uVar14 * 2] << 0xb;
          local_4c.m_high_color =
               (ushort)(byte)ryg_dxt::OMatch5_3[uVar17 * 2 + 1] |
               (ushort)(byte)ryg_dxt::OMatch6_3[uVar16 * 2 + 1] << 5 |
               (ushort)(byte)ryg_dxt::OMatch5_3[uVar14 * 2 + 1] << 0xb;
          bVar8 = evaluate_solution(this,&local_4c,false);
          bVar7 = (bool)(bVar7 | bVar8);
        }
      }
    }
  }
  return bVar7;
}

Assistant:

bool dxt1_endpoint_optimizer::try_average_block_as_solid() {
  uint64 tot_r = 0;
  uint64 tot_g = 0;
  uint64 tot_b = 0;

  uint total_weight = 0;
  for (uint i = 0; i < m_unique_colors.size(); i++) {
    uint weight = m_unique_colors[i].m_weight;
    total_weight += weight;

    tot_r += m_unique_colors[i].m_color.r * static_cast<uint64>(weight);
    tot_g += m_unique_colors[i].m_color.g * static_cast<uint64>(weight);
    tot_b += m_unique_colors[i].m_color.b * static_cast<uint64>(weight);
  }

  const uint half_total_weight = total_weight >> 1;
  uint ave_r = static_cast<uint>((tot_r + half_total_weight) / total_weight);
  uint ave_g = static_cast<uint>((tot_g + half_total_weight) / total_weight);
  uint ave_b = static_cast<uint>((tot_b + half_total_weight) / total_weight);

  uint low_color = (ryg_dxt::OMatch5[ave_r][0] << 11) | (ryg_dxt::OMatch6[ave_g][0] << 5) | ryg_dxt::OMatch5[ave_b][0];
  uint high_color = (ryg_dxt::OMatch5[ave_r][1] << 11) | (ryg_dxt::OMatch6[ave_g][1] << 5) | ryg_dxt::OMatch5[ave_b][1];
  bool improved = evaluate_solution(dxt1_solution_coordinates((uint16)low_color, (uint16)high_color));

  if ((m_pParams->m_use_alpha_blocks) && (m_best_solution.m_error)) {
    low_color = (ryg_dxt::OMatch5_3[ave_r][0] << 11) | (ryg_dxt::OMatch6_3[ave_g][0] << 5) | ryg_dxt::OMatch5_3[ave_b][0];
    high_color = (ryg_dxt::OMatch5_3[ave_r][1] << 11) | (ryg_dxt::OMatch6_3[ave_g][1] << 5) | ryg_dxt::OMatch5_3[ave_b][1];
    improved |= evaluate_solution(dxt1_solution_coordinates((uint16)low_color, (uint16)high_color));
  }

  if (m_pParams->m_quality == cCRNDXTQualityUber) {
    // Try compressing as all-solid using the other (non-average) colors in the block in uber.
    for (uint i = 0; i < m_unique_colors.size(); i++) {
      uint r = m_unique_colors[i].m_color[0];
      uint g = m_unique_colors[i].m_color[1];
      uint b = m_unique_colors[i].m_color[2];
      if ((r == ave_r) && (g == ave_g) && (b == ave_b))
        continue;

      uint low_color = (ryg_dxt::OMatch5[r][0] << 11) | (ryg_dxt::OMatch6[g][0] << 5) | ryg_dxt::OMatch5[b][0];
      uint high_color = (ryg_dxt::OMatch5[r][1] << 11) | (ryg_dxt::OMatch6[g][1] << 5) | ryg_dxt::OMatch5[b][1];
      improved |= evaluate_solution(dxt1_solution_coordinates((uint16)low_color, (uint16)high_color));

      if ((m_pParams->m_use_alpha_blocks) && (m_best_solution.m_error)) {
        low_color = (ryg_dxt::OMatch5_3[r][0] << 11) | (ryg_dxt::OMatch6_3[g][0] << 5) | ryg_dxt::OMatch5_3[b][0];
        high_color = (ryg_dxt::OMatch5_3[r][1] << 11) | (ryg_dxt::OMatch6_3[g][1] << 5) | ryg_dxt::OMatch5_3[b][1];
        improved |= evaluate_solution(dxt1_solution_coordinates((uint16)low_color, (uint16)high_color));
      }
    }
  }

  return improved;
}